

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
::
add_test_case<density_tests::detail::PutUInt16<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
          (QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
           *this)

{
  runtime_type local_8;
  
  local_8.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
       ::s_table;
  QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  ::add_test_case((QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                   *)this,&local_8,
                  detail::
                  PutUInt16<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                  ::put,detail::
                        PutUInt16<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                        ::reentrant_put,
                  detail::
                  PutUInt16<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                  ::consume,
                  detail::
                  PutUInt16<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
                  ::reentrant_consume);
  return;
}

Assistant:

void add_test_case()
        {
            using ElementType = typename PUT_CASE::ElementType;
            add_test_case(
              QUEUE::runtime_type::template make<ElementType>(),
              &PUT_CASE::put,
              &PUT_CASE::reentrant_put,
              &PUT_CASE::consume,
              &PUT_CASE::reentrant_consume);
        }